

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc_model_v2.c
# Opt level: O2

MPP_RET rc_model_v2_end(void *ctx,EncRcTask *task)

{
  EncRcTaskInfo *cfg;
  RK_S32 RVar1;
  
  cfg = &task->info;
  if ((rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2","enter ctx %p cfg %p\n","rc_model_v2_end",ctx,cfg);
  }
  if ((rc_debug & 0x40) != 0) {
    _mpp_log_l(4,"rc_model_v2","bits_mode_update real_bit %d","rc_model_v2_end",
               (ulong)(uint)(task->info).bit_real);
  }
  if (*(int *)((long)ctx + 8) != 2) {
    if ((rc_debug & 0x40) != 0) {
      _mpp_log_l(4,"rc_model_v2","motion_level %u, complex_level %u\n","rc_model_v2_end",
                 (ulong)(task->info).motion_level,(ulong)(task->info).complex_level);
    }
    mpp_data_update_v2(*(MppDataV2 **)((long)ctx + 0x1a8),(task->info).motion_level);
    mpp_data_update_v2(*(MppDataV2 **)((long)ctx + 0x1b0),(task->info).complex_level);
    RVar1 = *(RK_S32 *)((long)ctx + 0x1e0);
    (task->info).rt_bits = RVar1;
    *(RK_S32 *)((long)ctx + 0x1e4) = RVar1;
    *(undefined4 *)((long)ctx + 0x114) = 0;
    bits_model_update((RcModelV2Ctx *)ctx,cfg);
    if (*(int *)((long)ctx + 8) == 3) {
      moving_judge_update((RcModelV2Ctx *)ctx,cfg);
      bit_statics_update((RcModelV2Ctx *)ctx,(task->info).bit_real);
    }
    *(ulong *)((long)ctx + 0x25c) =
         CONCAT44((int)((ulong)*(undefined8 *)((long)ctx + 0x25c) >> 0x20) + 1,
                  *(int *)((long)ctx + 0x250) + (int)*(undefined8 *)((long)ctx + 0x25c));
    *(RK_S32 *)((long)ctx + 0x1f8) = (task->info).quality_real;
    *(RK_U32 *)((long)ctx + 0x264) = (task->info).iblk4_prop;
    *(undefined4 *)((long)ctx + 0x23c) = *(undefined4 *)((long)ctx + 0x24c);
    *(undefined4 *)((long)ctx + 600) = 0;
    *(undefined8 *)((long)ctx + 0x1bc) = *(undefined8 *)&(task->info).bit_target;
    *(RK_S32 *)((long)ctx + 0x1d8) = (task->info).bit_real;
    *(undefined8 *)((long)ctx + 0x270) = 0;
  }
  if ((rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc_model_v2","leave %p\n","rc_model_v2_end",ctx);
  }
  return MPP_OK;
}

Assistant:

MPP_RET rc_model_v2_end(void *ctx, EncRcTask *task)
{
    RcModelV2Ctx *p = (RcModelV2Ctx *)ctx;
    EncRcTaskInfo *cfg = (EncRcTaskInfo *)&task->info;
    RcCfg *usr_cfg = &p->usr_cfg;

    rc_dbg_func("enter ctx %p cfg %p\n", ctx, cfg);

    rc_dbg_rc("bits_mode_update real_bit %d", cfg->bit_real);

    if (usr_cfg->mode == RC_FIXQP)
        goto DONE;

    rc_dbg_rc("motion_level %u, complex_level %u\n", cfg->motion_level, cfg->complex_level);
    mpp_data_update_v2(p->motion_level, cfg->motion_level);
    mpp_data_update_v2(p->complex_level, cfg->complex_level);
    cfg->rt_bits = p->ins_bps;
    p->last_inst_bps = p->ins_bps;
    p->first_frm_flg = 0;

    bits_model_update(p, cfg);
    if (usr_cfg->mode == RC_AVBR) {
        moving_judge_update(p, cfg);
        bit_statics_update(p, cfg->bit_real);
    }

    p->gop_frm_cnt++;
    p->gop_qp_sum += p->start_qp;

    p->pre_mean_qp = cfg->quality_real;
    p->pre_iblk4_prop = cfg->iblk4_prop;
    p->scale_qp = p->cur_scale_qp;
    p->prev_md_prop = 0;
    p->pre_target_bits = cfg->bit_target;
    p->pre_target_bits_fix = cfg->bit_target_fix;
    p->pre_real_bits = cfg->bit_real;

    p->on_drop = 0;
    p->on_pskip = 0;

DONE:
    rc_dbg_func("leave %p\n", ctx);
    return MPP_OK;
}